

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_bound.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,ValuedAction *va)

{
  ostream *poVar1;
  ValuedAction *va_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,va->action);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,va->value);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const ValuedAction& va) {
	os << "(" << va.action << ", " << va.value << ")";
	return os;
}